

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes_enums.h
# Opt level: O2

char * MLFeatureTypeType_Name(MLFeatureTypeType x)

{
  if (x < 8) {
    return &DAT_002c445c + *(int *)(&DAT_002c445c + (ulong)x * 4);
  }
  return "INVALID";
}

Assistant:

__attribute__((__unused__))
static const char * MLFeatureTypeType_Name(MLFeatureTypeType x) {
    switch (x) {
        case MLFeatureTypeType_int64Type:
            return "MLFeatureTypeType_int64Type";
        case MLFeatureTypeType_doubleType:
            return "MLFeatureTypeType_doubleType";
        case MLFeatureTypeType_stringType:
            return "MLFeatureTypeType_stringType";
        case MLFeatureTypeType_imageType:
            return "MLFeatureTypeType_imageType";
        case MLFeatureTypeType_multiArrayType:
            return "MLFeatureTypeType_multiArrayType";
        case MLFeatureTypeType_dictionaryType:
            return "MLFeatureTypeType_dictionaryType";
        case MLFeatureTypeType_sequenceType:
            return "MLFeatureTypeType_sequenceType";
        case MLFeatureTypeType_NOT_SET:
            return "INVALID";
    }
    return "INVALID";
}